

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
either<toml::detail::character<'t'>,_toml::detail::sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>,_toml::detail::sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_68;
  
  character<'t'>::invoke(&local_68,loc);
  if (local_68.is_ok_ == true) {
    __return_storage_ptr__->is_ok_ = true;
    region::region(&(__return_storage_ptr__->field_1).succ.value,&local_68.field_1.succ.value);
  }
  else {
    either<toml::detail::sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>,_toml::detail::sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>_>
    ::invoke(__return_storage_ptr__,loc);
  }
  if (local_68.is_ok_ == true) {
    region::~region(&local_68.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }